

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_count_edges.h
# Opt level: O0

int s2shapeutil::CountEdgesUpTo<S2ShapeIndex>(S2ShapeIndex *index,int max_edges)

{
  bool bVar1;
  int iVar2;
  S2Shape *pSVar3;
  ShapeIterator it;
  ShapeIterator SVar4;
  S2Shape *shape;
  ShapeIterator __end0;
  undefined1 local_30 [8];
  ShapeIterator __begin0;
  S2ShapeIndex *__range2;
  int num_edges;
  int max_edges_local;
  S2ShapeIndex *index_local;
  
  __range2._0_4_ = 0;
  __begin0._8_8_ = index;
  SVar4 = S2ShapeIndex::begin(index);
  local_30 = (undefined1  [8])SVar4.index_;
  __begin0.index_._0_4_ = SVar4.shape_id_;
  SVar4 = S2ShapeIndex::end((S2ShapeIndex *)__begin0._8_8_);
  do {
    it._12_4_ = 0;
    it.index_ = (S2ShapeIndex *)SUB128(SVar4._0_12_,0);
    it.shape_id_ = SUB124(SVar4._0_12_,8);
    bVar1 = S2ShapeIndex::ShapeIterator::operator!=((ShapeIterator *)local_30,it);
    if (!bVar1) {
      return (int)__range2;
    }
    pSVar3 = S2ShapeIndex::ShapeIterator::operator*((ShapeIterator *)local_30);
    if (pSVar3 != (S2Shape *)0x0) {
      iVar2 = (*pSVar3->_vptr_S2Shape[2])();
      __range2._0_4_ = iVar2 + (int)__range2;
      if (max_edges <= (int)__range2) {
        return (int)__range2;
      }
    }
    S2ShapeIndex::ShapeIterator::operator++((ShapeIterator *)local_30);
  } while( true );
}

Assistant:

int CountEdgesUpTo(const S2ShapeIndexType& index, int max_edges) {
  int num_edges = 0;
  for (S2Shape* shape : index) {
    if (shape == nullptr) continue;
    num_edges += shape->num_edges();
    if (num_edges >= max_edges) break;
  }
  return num_edges;
}